

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webp_enc.c
# Opt level: O1

int WebPReportProgress(WebPPicture *pic,int percent,int *percent_store)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((percent_store != (int *)0x0) && (*percent_store != percent)) {
    *percent_store = percent;
    if (pic->progress_hook != (WebPProgressHook)0x0) {
      iVar1 = (*pic->progress_hook)(percent,pic);
      if (iVar1 == 0) {
        iVar2 = 0;
        if (pic->error_code == VP8_ENC_OK) {
          pic->error_code = VP8_ENC_ERROR_USER_ABORT;
          iVar2 = 0;
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int WebPReportProgress(const WebPPicture* const pic,
                       int percent, int* const percent_store) {
  if (percent_store != NULL && percent != *percent_store) {
    *percent_store = percent;
    if (pic->progress_hook && !pic->progress_hook(percent, pic)) {
      // user abort requested
      return WebPEncodingSetError(pic, VP8_ENC_ERROR_USER_ABORT);
    }
  }
  return 1;  // ok
}